

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayDelete(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  data_ptr_t pdVar1;
  int iVar2;
  reference pvVar3;
  TableCatalogEntry *pTVar4;
  undefined4 extraout_var;
  InternalException *this_00;
  idx_t i;
  ulong uVar5;
  row_t row_ids [1];
  LogicalType local_158;
  DataChunk chunk;
  Vector row_identifiers;
  TableDeleteState delete_state;
  
  DataChunk::DataChunk(&chunk);
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"chunk");
  (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
  DataChunk::Deserialize(&chunk,&deserializer->super_Deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  if (this->deserialize_only == false) {
    if ((this->state->current_table).ptr == (TableCatalogEntry *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&row_identifiers,"Corrupt WAL: delete without table",
                 (allocator *)&delete_state);
      InternalException::InternalException(this_00,(string *)&row_identifiers);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_158,BIGINT);
    Vector::Vector(&row_identifiers,&local_158,(data_ptr_t)row_ids);
    LogicalType::~LogicalType(&local_158);
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk.data,0);
    pdVar1 = pvVar3->data;
    TableDeleteState::TableDeleteState(&delete_state);
    for (uVar5 = 0; uVar5 < chunk.count; uVar5 = uVar5 + 1) {
      row_ids[0] = *(row_t *)(pdVar1 + uVar5 * 8);
      pTVar4 = optional_ptr<duckdb::TableCatalogEntry,_true>::operator->
                         (&this->state->current_table);
      iVar2 = (*(pTVar4->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0x10])(pTVar4);
      DataTable::Delete((DataTable *)CONCAT44(extraout_var,iVar2),&delete_state,this->context,
                        &row_identifiers,1);
    }
    TableDeleteState::~TableDeleteState(&delete_state);
    Vector::~Vector(&row_identifiers);
  }
  DataChunk::~DataChunk(&chunk);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayDelete() {
	DataChunk chunk;
	deserializer.ReadObject(101, "chunk", [&](Deserializer &object) { chunk.Deserialize(object); });
	if (DeserializeOnly()) {
		return;
	}
	if (!state.current_table) {
		throw InternalException("Corrupt WAL: delete without table");
	}

	D_ASSERT(chunk.ColumnCount() == 1 && chunk.data[0].GetType() == LogicalType::ROW_TYPE);
	row_t row_ids[1];
	Vector row_identifiers(LogicalType::ROW_TYPE, data_ptr_cast(row_ids));

	auto source_ids = FlatVector::GetData<row_t>(chunk.data[0]);
	// delete the tuples from the current table
	TableDeleteState delete_state;
	for (idx_t i = 0; i < chunk.size(); i++) {
		row_ids[0] = source_ids[i];
		state.current_table->GetStorage().Delete(delete_state, context, row_identifiers, 1);
	}
}